

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O1

void idct32_low16_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  int iVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  __m256i clamp_hi;
  __m256i clamp_lo;
  __m256i bf1 [32];
  int local_4a0;
  int iStack_49c;
  int iStack_498;
  int iStack_494;
  int iStack_490;
  int iStack_48c;
  int iStack_488;
  int iStack_484;
  int local_480;
  int iStack_47c;
  int iStack_478;
  int iStack_474;
  int iStack_470;
  int iStack_46c;
  int iStack_468;
  int iStack_464;
  __m256i local_460;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  lVar33 = (long)bit;
  lVar38 = lVar33 * 0x100;
  iVar2 = -*(int *)(&DAT_004e0e08 + lVar38);
  iVar22 = -*(int *)(&DAT_004e0dc8 + lVar38);
  iVar23 = -*(int *)(&DAT_004e0de8 + lVar38);
  iVar24 = -*(int *)(&DAT_004e0da8 + lVar38);
  iVar25 = -*(int *)(&DAT_004e0df0 + lVar38);
  iVar26 = -*(int *)(&DAT_004e0db0 + lVar38);
  iVar36 = 1 << ((char)bit - 1U & 0x1f);
  iVar3 = *(int *)(&DAT_004e0e00 + lVar38);
  iVar4 = *(int *)(&DAT_004e0d80 + lVar38);
  iVar5 = *(int *)(&DAT_004e0dc0 + lVar38);
  iVar6 = *(int *)(&DAT_004e0d40 + lVar33 * 0x20);
  iVar34 = -iVar5;
  iVar35 = -iVar6;
  iVar39 = -iVar3;
  iVar29 = -iVar4;
  iVar7 = *(int *)(&DAT_004e0da0 + lVar38);
  iVar30 = -iVar7;
  iVar8 = *(int *)(&DAT_004e0de0 + lVar38);
  iVar31 = -iVar8;
  iVar9 = *(int *)(&DAT_004e0d60 + lVar33 * 0x20);
  iVar32 = -iVar9;
  iVar37 = bd + 6 + (uint)(do_cols == 0) * 2;
  local_4a0 = 0x8000;
  if (0xf < iVar37) {
    local_4a0 = 1 << ((char)iVar37 - 1U & 0x1f);
  }
  uVar1 = *(undefined4 *)(&DAT_004e0e18 + lVar38);
  auVar70._4_4_ = uVar1;
  auVar70._0_4_ = uVar1;
  auVar70._8_4_ = uVar1;
  auVar70._12_4_ = uVar1;
  auVar70._16_4_ = uVar1;
  auVar70._20_4_ = uVar1;
  auVar70._24_4_ = uVar1;
  auVar70._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(&DAT_004e0d98 + lVar38);
  auVar52._4_4_ = uVar1;
  auVar52._0_4_ = uVar1;
  auVar52._8_4_ = uVar1;
  auVar52._12_4_ = uVar1;
  auVar52._16_4_ = uVar1;
  auVar52._20_4_ = uVar1;
  auVar52._24_4_ = uVar1;
  auVar52._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(&DAT_004e0dd8 + lVar38);
  auVar60._4_4_ = uVar1;
  auVar60._0_4_ = uVar1;
  auVar60._8_4_ = uVar1;
  auVar60._12_4_ = uVar1;
  auVar60._16_4_ = uVar1;
  auVar60._20_4_ = uVar1;
  auVar60._24_4_ = uVar1;
  auVar60._28_4_ = uVar1;
  local_480 = -local_4a0;
  uVar1 = *(undefined4 *)(&DAT_004e0d68 + lVar33 * 0x20);
  auVar63._4_4_ = uVar1;
  auVar63._0_4_ = uVar1;
  auVar63._8_4_ = uVar1;
  auVar63._12_4_ = uVar1;
  auVar63._16_4_ = uVar1;
  auVar63._20_4_ = uVar1;
  auVar63._24_4_ = uVar1;
  auVar63._28_4_ = uVar1;
  local_4a0 = local_4a0 + -1;
  iVar37 = LoadMaskz2[lVar33 * 8 + 7][2];
  auVar66._4_4_ = iVar37;
  auVar66._0_4_ = iVar37;
  auVar66._8_4_ = iVar37;
  auVar66._12_4_ = iVar37;
  auVar66._16_4_ = iVar37;
  auVar66._20_4_ = iVar37;
  auVar66._24_4_ = iVar37;
  auVar66._28_4_ = iVar37;
  auVar64._4_4_ = iVar36;
  auVar64._0_4_ = iVar36;
  auVar64._8_4_ = iVar36;
  auVar64._12_4_ = iVar36;
  auVar64._16_4_ = iVar36;
  auVar64._20_4_ = iVar36;
  auVar64._24_4_ = iVar36;
  auVar64._28_4_ = iVar36;
  auVar41 = vpmulld_avx2((undefined1  [32])in[1],auVar66);
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  auVar10 = vpsrad_avx2(auVar41,ZEXT416((uint)bit));
  auVar40._4_4_ = iVar24;
  auVar40._0_4_ = iVar24;
  auVar40._8_4_ = iVar24;
  auVar40._12_4_ = iVar24;
  auVar40._16_4_ = iVar24;
  auVar40._20_4_ = iVar24;
  auVar40._24_4_ = iVar24;
  auVar40._28_4_ = iVar24;
  auVar41 = vpmulld_avx2((undefined1  [32])in[1],auVar70);
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  auVar66 = vpsrad_avx2(auVar41,ZEXT416((uint)bit));
  auVar41 = vpmulld_avx2((undefined1  [32])in[0xf],auVar40);
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  auVar65 = ZEXT416((uint)bit);
  auVar49 = vpsrad_avx2(auVar41,auVar65);
  auVar41 = vpmulld_avx2((undefined1  [32])in[0xf],auVar52);
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  auVar70 = vpsrad_avx2(auVar41,auVar65);
  auVar41 = vpmulld_avx2((undefined1  [32])in[9],auVar63);
  auVar40 = vpmulld_avx2((undefined1  [32])in[9],auVar60);
  auVar53._4_4_ = iVar23;
  auVar53._0_4_ = iVar23;
  auVar53._8_4_ = iVar23;
  auVar53._12_4_ = iVar23;
  auVar53._16_4_ = iVar23;
  auVar53._20_4_ = iVar23;
  auVar53._24_4_ = iVar23;
  auVar53._28_4_ = iVar23;
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  auVar60 = vpsrad_avx2(auVar41,auVar65);
  auVar41 = vpaddd_avx2(auVar40,auVar64);
  auVar52 = vpsrad_avx2(auVar41,auVar65);
  auVar41 = vpmulld_avx2((undefined1  [32])in[7],auVar53);
  uVar1 = *(undefined4 *)(&DAT_004e0d58 + lVar33 * 0x20);
  auVar54._4_4_ = uVar1;
  auVar54._0_4_ = uVar1;
  auVar54._8_4_ = uVar1;
  auVar54._12_4_ = uVar1;
  auVar54._16_4_ = uVar1;
  auVar54._20_4_ = uVar1;
  auVar54._24_4_ = uVar1;
  auVar54._28_4_ = uVar1;
  auVar40 = vpmulld_avx2((undefined1  [32])in[7],auVar54);
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  auVar65 = ZEXT416((uint)bit);
  auVar45 = vpsrad_avx2(auVar41,auVar65);
  auVar41 = vpaddd_avx2(auVar40,auVar64);
  auVar54 = vpsrad_avx2(auVar41,auVar65);
  uVar1 = *(undefined4 *)(&DAT_004e0d48 + lVar33 * 0x20);
  auVar41._4_4_ = uVar1;
  auVar41._0_4_ = uVar1;
  auVar41._8_4_ = uVar1;
  auVar41._12_4_ = uVar1;
  auVar41._16_4_ = uVar1;
  auVar41._20_4_ = uVar1;
  auVar41._24_4_ = uVar1;
  auVar41._28_4_ = uVar1;
  auVar41 = vpmulld_avx2((undefined1  [32])in[5],auVar41);
  uVar1 = *(undefined4 *)(&DAT_004e0df8 + lVar38);
  auVar55._4_4_ = uVar1;
  auVar55._0_4_ = uVar1;
  auVar55._8_4_ = uVar1;
  auVar55._12_4_ = uVar1;
  auVar55._16_4_ = uVar1;
  auVar55._20_4_ = uVar1;
  auVar55._24_4_ = uVar1;
  auVar55._28_4_ = uVar1;
  auVar40 = vpmulld_avx2((undefined1  [32])in[5],auVar55);
  auVar56._4_4_ = iVar22;
  auVar56._0_4_ = iVar22;
  auVar56._8_4_ = iVar22;
  auVar56._12_4_ = iVar22;
  auVar56._16_4_ = iVar22;
  auVar56._20_4_ = iVar22;
  auVar56._24_4_ = iVar22;
  auVar56._28_4_ = iVar22;
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  auVar53 = vpsrad_avx2(auVar41,auVar65);
  auVar41 = vpaddd_avx2(auVar40,auVar64);
  auVar55 = vpsrad_avx2(auVar41,auVar65);
  auVar41 = vpmulld_avx2((undefined1  [32])in[0xb],auVar56);
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  auVar50 = vpsrad_avx2(auVar41,auVar65);
  uVar1 = *(undefined4 *)(&DAT_004e0d78 + lVar38);
  auVar46._4_4_ = uVar1;
  auVar46._0_4_ = uVar1;
  auVar46._8_4_ = uVar1;
  auVar46._12_4_ = uVar1;
  auVar46._16_4_ = uVar1;
  auVar46._20_4_ = uVar1;
  auVar46._24_4_ = uVar1;
  auVar46._28_4_ = uVar1;
  auVar41 = vpmulld_avx2((undefined1  [32])in[0xb],auVar46);
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  auVar46 = vpsrad_avx2(auVar41,auVar65);
  uVar1 = *(undefined4 *)(&DAT_004e0d88 + lVar38);
  auVar42._4_4_ = uVar1;
  auVar42._0_4_ = uVar1;
  auVar42._8_4_ = uVar1;
  auVar42._12_4_ = uVar1;
  auVar42._16_4_ = uVar1;
  auVar42._20_4_ = uVar1;
  auVar42._24_4_ = uVar1;
  auVar42._28_4_ = uVar1;
  auVar41 = vpmulld_avx2((undefined1  [32])in[0xd],auVar42);
  uVar1 = *(undefined4 *)(&DAT_004e0db8 + lVar38);
  auVar57._4_4_ = uVar1;
  auVar57._0_4_ = uVar1;
  auVar57._8_4_ = uVar1;
  auVar57._12_4_ = uVar1;
  auVar57._16_4_ = uVar1;
  auVar57._20_4_ = uVar1;
  auVar57._24_4_ = uVar1;
  auVar57._28_4_ = uVar1;
  auVar40 = vpmulld_avx2((undefined1  [32])in[0xd],auVar57);
  auVar61._4_4_ = iVar2;
  auVar61._0_4_ = iVar2;
  auVar61._8_4_ = iVar2;
  auVar61._12_4_ = iVar2;
  auVar61._16_4_ = iVar2;
  auVar61._20_4_ = iVar2;
  auVar61._24_4_ = iVar2;
  auVar61._28_4_ = iVar2;
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  auVar56 = vpsrad_avx2(auVar41,auVar65);
  auVar41 = vpaddd_avx2(auVar40,auVar64);
  auVar57 = vpsrad_avx2(auVar41,auVar65);
  auVar41 = vpmulld_avx2((undefined1  [32])in[3],auVar61);
  iVar2 = LoadMaskz2[lVar33 * 8 + 7][6];
  auVar62._4_4_ = iVar2;
  auVar62._0_4_ = iVar2;
  auVar62._8_4_ = iVar2;
  auVar62._12_4_ = iVar2;
  auVar62._16_4_ = iVar2;
  auVar62._20_4_ = iVar2;
  auVar62._24_4_ = iVar2;
  auVar62._28_4_ = iVar2;
  auVar40 = vpmulld_avx2((undefined1  [32])in[3],auVar62);
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  auVar65 = ZEXT416((uint)bit);
  auVar61 = vpsrad_avx2(auVar41,auVar65);
  auVar41 = vpaddd_avx2(auVar40,auVar64);
  auVar62 = vpsrad_avx2(auVar41,auVar65);
  iVar2 = LoadMaskz2[lVar33 * 8 + 7][4];
  auVar47._4_4_ = iVar2;
  auVar47._0_4_ = iVar2;
  auVar47._8_4_ = iVar2;
  auVar47._12_4_ = iVar2;
  auVar47._16_4_ = iVar2;
  auVar47._20_4_ = iVar2;
  auVar47._24_4_ = iVar2;
  auVar47._28_4_ = iVar2;
  auVar41 = vpmulld_avx2((undefined1  [32])in[2],auVar47);
  uVar1 = *(undefined4 *)(&DAT_004e0e10 + lVar38);
  auVar73._4_4_ = uVar1;
  auVar73._0_4_ = uVar1;
  auVar73._8_4_ = uVar1;
  auVar73._12_4_ = uVar1;
  auVar73._16_4_ = uVar1;
  auVar73._20_4_ = uVar1;
  auVar73._24_4_ = uVar1;
  auVar73._28_4_ = uVar1;
  auVar40 = vpmulld_avx2((undefined1  [32])in[2],auVar73);
  auVar74._4_4_ = iVar26;
  auVar74._0_4_ = iVar26;
  auVar74._8_4_ = iVar26;
  auVar74._12_4_ = iVar26;
  auVar74._16_4_ = iVar26;
  auVar74._20_4_ = iVar26;
  auVar74._24_4_ = iVar26;
  auVar74._28_4_ = iVar26;
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  auVar47 = vpsrad_avx2(auVar41,auVar65);
  auVar41 = vpaddd_avx2(auVar40,auVar64);
  auVar63 = vpsrad_avx2(auVar41,auVar65);
  auVar41 = vpmulld_avx2((undefined1  [32])in[0xe],auVar74);
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  auVar11 = vpsrad_avx2(auVar41,auVar65);
  uVar1 = *(undefined4 *)(&DAT_004e0d90 + lVar38);
  auVar75._4_4_ = uVar1;
  auVar75._0_4_ = uVar1;
  auVar75._8_4_ = uVar1;
  auVar75._12_4_ = uVar1;
  auVar75._16_4_ = uVar1;
  auVar75._20_4_ = uVar1;
  auVar75._24_4_ = uVar1;
  auVar75._28_4_ = uVar1;
  auVar41 = vpmulld_avx2((undefined1  [32])in[0xe],auVar75);
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  auVar73 = vpsrad_avx2(auVar41,auVar65);
  uVar1 = *(undefined4 *)(&DAT_004e0d70 + lVar33 * 0x20);
  auVar48._4_4_ = uVar1;
  auVar48._0_4_ = uVar1;
  auVar48._8_4_ = uVar1;
  auVar48._12_4_ = uVar1;
  auVar48._16_4_ = uVar1;
  auVar48._20_4_ = uVar1;
  auVar48._24_4_ = uVar1;
  auVar48._28_4_ = uVar1;
  auVar41 = vpmulld_avx2((undefined1  [32])in[10],auVar48);
  uVar1 = *(undefined4 *)(&DAT_004e0dd0 + lVar38);
  auVar79._4_4_ = uVar1;
  auVar79._0_4_ = uVar1;
  auVar79._8_4_ = uVar1;
  auVar79._12_4_ = uVar1;
  auVar79._16_4_ = uVar1;
  auVar79._20_4_ = uVar1;
  auVar79._24_4_ = uVar1;
  auVar79._28_4_ = uVar1;
  auVar40 = vpmulld_avx2((undefined1  [32])in[10],auVar79);
  auVar43._4_4_ = iVar25;
  auVar43._0_4_ = iVar25;
  auVar43._8_4_ = iVar25;
  auVar43._12_4_ = iVar25;
  auVar43._16_4_ = iVar25;
  auVar43._20_4_ = iVar25;
  auVar43._24_4_ = iVar25;
  auVar43._28_4_ = iVar25;
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  auVar48 = vpsrad_avx2(auVar41,auVar65);
  auVar41 = vpaddd_avx2(auVar40,auVar64);
  auVar12 = vpsrad_avx2(auVar41,auVar65);
  auVar42 = vpmulld_avx2((undefined1  [32])in[6],auVar43);
  uVar1 = *(undefined4 *)(&DAT_004e0d50 + lVar33 * 0x20);
  auVar44._4_4_ = uVar1;
  auVar44._0_4_ = uVar1;
  auVar44._8_4_ = uVar1;
  auVar44._12_4_ = uVar1;
  auVar44._16_4_ = uVar1;
  auVar44._20_4_ = uVar1;
  auVar44._24_4_ = uVar1;
  auVar44._28_4_ = uVar1;
  auVar43 = vpmulld_avx2((undefined1  [32])in[6],auVar44);
  auVar41 = vpaddd_avx2(auVar49,auVar66);
  auVar44 = vpsubd_avx2(auVar66,auVar49);
  auVar40 = vpaddd_avx2(auVar45,auVar52);
  auVar58 = vpsubd_avx2(auVar45,auVar52);
  auVar66 = vpaddd_avx2(auVar50,auVar55);
  auVar68 = vpsubd_avx2(auVar55,auVar50);
  auVar49 = vpaddd_avx2(auVar61,auVar57);
  auVar74 = vpsubd_avx2(auVar61,auVar57);
  auVar52 = vpaddd_avx2(auVar62,auVar56);
  auVar75 = vpsubd_avx2(auVar62,auVar56);
  auVar45 = vpaddd_avx2(auVar46,auVar53);
  auVar79 = vpsubd_avx2(auVar53,auVar46);
  auVar53 = vpaddd_avx2(auVar54,auVar60);
  auVar13 = vpsubd_avx2(auVar54,auVar60);
  auVar60 = vpaddd_avx2(auVar70,auVar10);
  auVar50 = vpsubd_avx2(auVar10,auVar70);
  auVar42 = vpaddd_avx2(auVar64,auVar42);
  auVar70 = vpsrad_avx2(auVar42,auVar65);
  auVar42 = vpaddd_avx2(auVar11,auVar63);
  auVar14 = vpsubd_avx2(auVar63,auVar11);
  auVar10 = vpaddd_avx2(auVar70,auVar12);
  auVar15 = vpsubd_avx2(auVar70,auVar12);
  auVar43 = vpaddd_avx2(auVar64,auVar43);
  auVar70 = vpsrad_avx2(auVar43,auVar65);
  auVar43 = vpaddd_avx2(auVar48,auVar70);
  auVar16 = vpsubd_avx2(auVar70,auVar48);
  auVar70 = vpaddd_avx2(auVar73,auVar47);
  auVar17 = vpsubd_avx2(auVar47,auVar73);
  auVar67._4_4_ = iVar3;
  auVar67._0_4_ = iVar3;
  auVar67._8_4_ = iVar3;
  auVar67._12_4_ = iVar3;
  auVar67._16_4_ = iVar3;
  auVar67._20_4_ = iVar3;
  auVar67._24_4_ = iVar3;
  auVar67._28_4_ = iVar3;
  auVar72._4_4_ = iVar35;
  auVar72._0_4_ = iVar35;
  auVar72._8_4_ = iVar35;
  auVar72._12_4_ = iVar35;
  auVar72._16_4_ = iVar35;
  auVar72._20_4_ = iVar35;
  auVar72._24_4_ = iVar35;
  auVar72._28_4_ = iVar35;
  auVar28._4_4_ = local_480;
  auVar28._0_4_ = local_480;
  auVar28._8_4_ = local_480;
  auVar28._12_4_ = local_480;
  auVar28._16_4_ = local_480;
  auVar28._20_4_ = local_480;
  auVar28._24_4_ = local_480;
  auVar28._28_4_ = local_480;
  auVar54 = vpmaxsd_avx2(auVar28,auVar44);
  auVar27._4_4_ = local_4a0;
  auVar27._0_4_ = local_4a0;
  auVar27._8_4_ = local_4a0;
  auVar27._12_4_ = local_4a0;
  auVar27._16_4_ = local_4a0;
  auVar27._20_4_ = local_4a0;
  auVar27._24_4_ = local_4a0;
  auVar27._28_4_ = local_4a0;
  auVar55 = vpminsd_avx2(auVar54,auVar27);
  auVar54 = vpmaxsd_avx2(auVar50,auVar28);
  auVar50 = vpminsd_avx2(auVar54,auVar27);
  auVar54 = vpmulld_avx2(auVar50,auVar67);
  auVar54 = vpaddd_avx2(auVar64,auVar54);
  auVar46 = vpmulld_avx2(auVar55,auVar72);
  auVar54 = vpaddd_avx2(auVar46,auVar54);
  auVar77._4_4_ = iVar6;
  auVar77._0_4_ = iVar6;
  auVar77._8_4_ = iVar6;
  auVar77._12_4_ = iVar6;
  auVar77._16_4_ = iVar6;
  auVar77._20_4_ = iVar6;
  auVar77._24_4_ = iVar6;
  auVar77._28_4_ = iVar6;
  auVar41 = vpmaxsd_avx2(auVar28,auVar41);
  auVar46 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar40,auVar28);
  auVar56 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar58,auVar28);
  auVar57 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar66);
  auVar61 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar68,auVar28);
  auVar62 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar49);
  auVar47 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar74);
  auVar63 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar52);
  auVar11 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar75);
  auVar73 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar45);
  auVar48 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar79);
  auVar52 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar53);
  auVar12 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar13);
  auVar66 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar60);
  auVar44 = vpminsd_avx2(auVar41,auVar27);
  auVar40 = vpmulld_avx2(auVar55,auVar67);
  auVar41 = vpmulld_avx2(auVar50,auVar77);
  auVar41 = vpaddd_avx2(auVar64,auVar41);
  auVar41 = vpaddd_avx2(auVar40,auVar41);
  auVar49._4_4_ = iVar39;
  auVar49._0_4_ = iVar39;
  auVar49._8_4_ = iVar39;
  auVar49._12_4_ = iVar39;
  auVar49._16_4_ = iVar39;
  auVar49._20_4_ = iVar39;
  auVar49._24_4_ = iVar39;
  auVar49._28_4_ = iVar39;
  auVar49 = vpmulld_avx2(auVar57,auVar49);
  auVar40 = vpmulld_avx2(auVar66,auVar72);
  auVar40 = vpaddd_avx2(auVar64,auVar40);
  auVar40 = vpaddd_avx2(auVar49,auVar40);
  auVar49 = vpmulld_avx2(auVar57,auVar72);
  auVar53 = vpmulld_avx2((undefined1  [32])in[4],auVar77);
  auVar60 = vpmulld_avx2((undefined1  [32])in[4],auVar67);
  auVar66 = vpmulld_avx2(auVar66,auVar67);
  auVar66 = vpaddd_avx2(auVar64,auVar66);
  auVar66 = vpaddd_avx2(auVar49,auVar66);
  auVar58._4_4_ = iVar4;
  auVar58._0_4_ = iVar4;
  auVar58._8_4_ = iVar4;
  auVar58._12_4_ = iVar4;
  auVar58._16_4_ = iVar4;
  auVar58._20_4_ = iVar4;
  auVar58._24_4_ = iVar4;
  auVar58._28_4_ = iVar4;
  auVar50._4_4_ = iVar34;
  auVar50._0_4_ = iVar34;
  auVar50._8_4_ = iVar34;
  auVar50._12_4_ = iVar34;
  auVar50._16_4_ = iVar34;
  auVar50._20_4_ = iVar34;
  auVar50._24_4_ = iVar34;
  auVar50._28_4_ = iVar34;
  auVar49 = vpmulld_avx2(auVar52,auVar58);
  auVar49 = vpaddd_avx2(auVar64,auVar49);
  auVar45 = vpmulld_avx2(auVar62,auVar50);
  auVar49 = vpaddd_avx2(auVar45,auVar49);
  auVar68._4_4_ = iVar5;
  auVar68._0_4_ = iVar5;
  auVar68._8_4_ = iVar5;
  auVar68._12_4_ = iVar5;
  auVar68._16_4_ = iVar5;
  auVar68._20_4_ = iVar5;
  auVar68._24_4_ = iVar5;
  auVar68._28_4_ = iVar5;
  auVar52 = vpmulld_avx2(auVar52,auVar68);
  auVar45 = vpmulld_avx2(auVar62,auVar58);
  auVar52 = vpaddd_avx2(auVar64,auVar52);
  auVar52 = vpaddd_avx2(auVar45,auVar52);
  auVar45._4_4_ = iVar29;
  auVar45._0_4_ = iVar29;
  auVar45._8_4_ = iVar29;
  auVar45._12_4_ = iVar29;
  auVar45._16_4_ = iVar29;
  auVar45._20_4_ = iVar29;
  auVar45._24_4_ = iVar29;
  auVar45._28_4_ = iVar29;
  auVar55 = vpmulld_avx2(auVar63,auVar45);
  auVar45 = vpmulld_avx2(auVar73,auVar50);
  auVar45 = vpaddd_avx2(auVar64,auVar45);
  auVar45 = vpaddd_avx2(auVar55,auVar45);
  auVar53 = vpaddd_avx2(auVar53,auVar64);
  auVar57 = vpsrad_avx2(auVar53,auVar65);
  auVar53 = vpaddd_avx2(auVar60,auVar64);
  auVar62 = vpsrad_avx2(auVar53,auVar65);
  auVar60 = vpmulld_avx2(auVar63,auVar50);
  auVar55 = vpmulld_avx2((undefined1  [32])in[0xc],auVar50);
  auVar50 = vpmulld_avx2((undefined1  [32])in[0xc],auVar58);
  auVar53 = vpmulld_avx2(auVar73,auVar58);
  auVar53 = vpaddd_avx2(auVar64,auVar53);
  auVar53 = vpaddd_avx2(auVar60,auVar53);
  auVar60 = vpaddd_avx2(auVar55,auVar64);
  auVar55 = vpsrad_avx2(auVar60,auVar65);
  auVar60 = vpaddd_avx2(auVar50,auVar64);
  auVar50 = vpsrad_avx2(auVar60,auVar65);
  auVar60 = vpaddd_avx2(auVar55,auVar62);
  auVar75 = vpsubd_avx2(auVar62,auVar55);
  auVar55 = vpaddd_avx2(auVar50,auVar57);
  auVar79 = vpsubd_avx2(auVar57,auVar50);
  auVar71._4_4_ = iVar8;
  auVar71._0_4_ = iVar8;
  auVar71._8_4_ = iVar8;
  auVar71._12_4_ = iVar8;
  auVar71._16_4_ = iVar8;
  auVar71._20_4_ = iVar8;
  auVar71._24_4_ = iVar8;
  auVar71._28_4_ = iVar8;
  auVar76._4_4_ = iVar32;
  auVar76._0_4_ = iVar32;
  auVar76._8_4_ = iVar32;
  auVar76._12_4_ = iVar32;
  auVar76._16_4_ = iVar32;
  auVar76._20_4_ = iVar32;
  auVar76._24_4_ = iVar32;
  auVar76._28_4_ = iVar32;
  auVar50 = vpmaxsd_avx2(auVar28,auVar14);
  auVar57 = vpminsd_avx2(auVar50,auVar27);
  auVar50 = vpmaxsd_avx2(auVar28,auVar17);
  auVar62 = vpminsd_avx2(auVar50,auVar27);
  auVar50 = vpmulld_avx2(auVar62,auVar71);
  auVar50 = vpaddd_avx2(auVar64,auVar50);
  auVar63 = vpmulld_avx2(auVar57,auVar76);
  auVar50 = vpaddd_avx2(auVar63,auVar50);
  auVar78._4_4_ = iVar9;
  auVar78._0_4_ = iVar9;
  auVar78._8_4_ = iVar9;
  auVar78._12_4_ = iVar9;
  auVar78._16_4_ = iVar9;
  auVar78._20_4_ = iVar9;
  auVar78._24_4_ = iVar9;
  auVar78._28_4_ = iVar9;
  auVar42 = vpmaxsd_avx2(auVar28,auVar42);
  auVar63 = vpminsd_avx2(auVar42,auVar27);
  auVar42 = vpmaxsd_avx2(auVar28,auVar10);
  auVar73 = vpminsd_avx2(auVar42,auVar27);
  auVar42 = vpmaxsd_avx2(auVar28,auVar15);
  auVar58 = vpminsd_avx2(auVar42,auVar27);
  auVar42 = vpmaxsd_avx2(auVar28,auVar43);
  auVar68 = vpminsd_avx2(auVar42,auVar27);
  auVar42 = vpmaxsd_avx2(auVar28,auVar16);
  auVar43 = vpminsd_avx2(auVar42,auVar27);
  auVar42 = vpmaxsd_avx2(auVar28,auVar70);
  auVar74 = vpminsd_avx2(auVar42,auVar27);
  auVar10 = vpmulld_avx2(auVar57,auVar71);
  auVar42 = vpmulld_avx2(auVar62,auVar78);
  auVar42 = vpaddd_avx2(auVar64,auVar42);
  auVar42 = vpaddd_avx2(auVar10,auVar42);
  auVar51._4_4_ = iVar31;
  auVar51._0_4_ = iVar31;
  auVar51._8_4_ = iVar31;
  auVar51._12_4_ = iVar31;
  auVar51._16_4_ = iVar31;
  auVar51._20_4_ = iVar31;
  auVar51._24_4_ = iVar31;
  auVar51._28_4_ = iVar31;
  auVar10 = vpmulld_avx2(auVar43,auVar76);
  auVar10 = vpaddd_avx2(auVar64,auVar10);
  auVar70 = vpmulld_avx2(auVar58,auVar51);
  auVar10 = vpaddd_avx2(auVar70,auVar10);
  auVar70 = vpmulld_avx2(auVar58,auVar76);
  auVar43 = vpmulld_avx2(auVar43,auVar71);
  auVar43 = vpaddd_avx2(auVar64,auVar43);
  auVar43 = vpaddd_avx2(auVar70,auVar43);
  auVar70 = vpaddd_avx2(auVar56,auVar46);
  auVar58 = vpsubd_avx2(auVar46,auVar56);
  auVar54 = vpsrad_avx2(auVar54,auVar65);
  auVar46 = vpsrad_avx2(auVar41,auVar65);
  auVar65 = ZEXT416((uint)bit);
  auVar40 = vpsrad_avx2(auVar40,auVar65);
  auVar56 = vpsrad_avx2(auVar66,auVar65);
  auVar41 = vpaddd_avx2(auVar40,auVar54);
  auVar13 = vpsubd_avx2(auVar54,auVar40);
  auVar40 = vpaddd_avx2(auVar61,auVar47);
  auVar14 = vpsubd_avx2(auVar47,auVar61);
  auVar49 = vpsrad_avx2(auVar49,auVar65);
  auVar54 = vpsrad_avx2(auVar52,auVar65);
  auVar52 = vpsrad_avx2(auVar45,auVar65);
  auVar45 = vpsrad_avx2(auVar53,auVar65);
  auVar66 = vpaddd_avx2(auVar52,auVar49);
  auVar15 = vpsubd_avx2(auVar52,auVar49);
  auVar49 = vpaddd_avx2(auVar48,auVar11);
  auVar16 = vpsubd_avx2(auVar11,auVar48);
  auVar52 = vpaddd_avx2(auVar45,auVar54);
  auVar17 = vpsubd_avx2(auVar45,auVar54);
  auVar45 = vpaddd_avx2(auVar12,auVar44);
  auVar67 = vpsubd_avx2(auVar44,auVar12);
  auVar69._4_4_ = iVar7;
  auVar69._0_4_ = iVar7;
  auVar69._8_4_ = iVar7;
  auVar69._12_4_ = iVar7;
  auVar69._16_4_ = iVar7;
  auVar69._20_4_ = iVar7;
  auVar69._24_4_ = iVar7;
  auVar69._28_4_ = iVar7;
  auVar54 = vpmulld_avx2(auVar69,(undefined1  [32])*in);
  auVar53 = vpaddd_avx2(auVar56,auVar46);
  auVar11 = vpsubd_avx2(auVar46,auVar56);
  auVar54 = vpaddd_avx2(auVar54,auVar64);
  auVar56 = vpsrad_avx2(auVar54,auVar65);
  auVar54 = vpmulld_avx2((undefined1  [32])in[8],auVar78);
  auVar54 = vpaddd_avx2(auVar54,auVar64);
  auVar46 = vpsrad_avx2(auVar54,auVar65);
  auVar54 = vpmulld_avx2((undefined1  [32])in[8],auVar71);
  auVar54 = vpaddd_avx2(auVar54,auVar64);
  auVar57 = vpsrad_avx2(auVar54,auVar65);
  auVar54 = vpaddd_avx2(auVar46,auVar56);
  auVar72 = vpsubd_avx2(auVar56,auVar46);
  auVar46 = vpaddd_avx2(auVar57,auVar56);
  auVar77 = vpsubd_avx2(auVar56,auVar57);
  auVar59._4_4_ = iVar30;
  auVar59._0_4_ = iVar30;
  auVar59._8_4_ = iVar30;
  auVar59._12_4_ = iVar30;
  auVar59._16_4_ = iVar30;
  auVar59._20_4_ = iVar30;
  auVar59._24_4_ = iVar30;
  auVar59._28_4_ = iVar30;
  auVar56 = vpmaxsd_avx2(auVar28,auVar75);
  auVar57 = vpminsd_avx2(auVar56,auVar27);
  auVar56 = vpmaxsd_avx2(auVar28,auVar79);
  auVar61 = vpminsd_avx2(auVar56,auVar27);
  auVar56 = vpmulld_avx2(auVar61,auVar69);
  auVar56 = vpaddd_avx2(auVar56,auVar64);
  auVar62 = vpmulld_avx2(auVar57,auVar59);
  auVar56 = vpaddd_avx2(auVar62,auVar56);
  auVar60 = vpmaxsd_avx2(auVar28,auVar60);
  auVar62 = vpminsd_avx2(auVar60,auVar27);
  auVar60 = vpmaxsd_avx2(auVar28,auVar55);
  auVar47 = vpminsd_avx2(auVar60,auVar27);
  auVar60 = vpaddd_avx2(auVar61,auVar57);
  auVar55 = vpaddd_avx2(auVar73,auVar63);
  auVar18 = vpsubd_avx2(auVar63,auVar73);
  auVar50 = vpsrad_avx2(auVar50,auVar65);
  auVar57 = vpsrad_avx2(auVar42,auVar65);
  auVar10 = vpsrad_avx2(auVar10,auVar65);
  auVar61 = vpsrad_avx2(auVar43,auVar65);
  auVar42 = vpaddd_avx2(auVar10,auVar50);
  auVar19 = vpsubd_avx2(auVar50,auVar10);
  auVar10 = vpaddd_avx2(auVar68,auVar74);
  auVar20 = vpsubd_avx2(auVar74,auVar68);
  auVar43 = vpaddd_avx2(auVar61,auVar57);
  auVar21 = vpsubd_avx2(auVar57,auVar61);
  auVar50 = vpmaxsd_avx2(auVar28,auVar13);
  auVar57 = vpminsd_avx2(auVar50,auVar27);
  auVar50 = vpmaxsd_avx2(auVar11,auVar28);
  auVar61 = vpminsd_avx2(auVar50,auVar27);
  auVar50 = vpmulld_avx2(auVar57,auVar76);
  auVar50 = vpaddd_avx2(auVar50,auVar64);
  auVar63 = vpmulld_avx2(auVar61,auVar71);
  auVar50 = vpaddd_avx2(auVar50,auVar63);
  auVar70 = vpmaxsd_avx2(auVar28,auVar70);
  auVar63 = vpminsd_avx2(auVar70,auVar27);
  auVar70 = vpmaxsd_avx2(auVar28,auVar58);
  auVar70 = vpminsd_avx2(auVar70,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar41);
  auVar11 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar40);
  auVar73 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar14);
  auVar48 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar66);
  auVar12 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar15);
  auVar44 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar49);
  auVar58 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar16);
  auVar68 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar52);
  auVar74 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar17);
  auVar75 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar45);
  auVar79 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar67);
  auVar66 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmaxsd_avx2(auVar28,auVar53);
  auVar13 = vpminsd_avx2(auVar41,auVar27);
  auVar41 = vpmulld_avx2(auVar57,auVar71);
  auVar40 = vpmulld_avx2(auVar61,auVar78);
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  auVar41 = vpaddd_avx2(auVar40,auVar41);
  auVar40 = vpmulld_avx2(auVar66,auVar71);
  auVar40 = vpaddd_avx2(auVar64,auVar40);
  auVar49 = vpmulld_avx2(auVar70,auVar76);
  auVar40 = vpaddd_avx2(auVar49,auVar40);
  auVar66 = vpmulld_avx2(auVar66,auVar78);
  auVar49 = vpmulld_avx2(auVar70,auVar71);
  auVar66 = vpaddd_avx2(auVar64,auVar66);
  auVar66 = vpaddd_avx2(auVar49,auVar66);
  auVar49 = vpmulld_avx2(auVar68,auVar76);
  auVar49 = vpaddd_avx2(auVar64,auVar49);
  auVar52 = vpmulld_avx2(auVar48,auVar51);
  auVar49 = vpaddd_avx2(auVar52,auVar49);
  auVar45 = vpmulld_avx2(auVar48,auVar76);
  auVar52 = vpmulld_avx2(auVar68,auVar71);
  auVar52 = vpaddd_avx2(auVar64,auVar52);
  auVar52 = vpaddd_avx2(auVar45,auVar52);
  auVar45 = vpmulld_avx2(auVar44,auVar51);
  auVar45 = vpaddd_avx2(auVar45,auVar64);
  auVar53 = vpmulld_avx2(auVar75,auVar76);
  auVar45 = vpaddd_avx2(auVar45,auVar53);
  auVar53 = vpmulld_avx2(auVar44,auVar76);
  auVar70 = vpmulld_avx2(auVar75,auVar71);
  auVar53 = vpaddd_avx2(auVar53,auVar64);
  auVar53 = vpaddd_avx2(auVar53,auVar70);
  auVar70 = vpmaxsd_avx2(auVar28,auVar54);
  auVar54 = vpminsd_avx2(auVar70,auVar27);
  auVar70 = vpaddd_avx2(auVar54,auVar47);
  auVar47 = vpsubd_avx2(auVar54,auVar47);
  auVar54 = vpmaxsd_avx2(auVar28,auVar72);
  auVar57 = vpminsd_avx2(auVar54,auVar27);
  auVar54 = vpmaxsd_avx2(auVar28,auVar46);
  auVar46 = vpminsd_avx2(auVar54,auVar27);
  auVar54 = vpmaxsd_avx2(auVar28,auVar77);
  auVar61 = vpminsd_avx2(auVar54,auVar27);
  auVar60 = vpmulld_avx2(auVar69,auVar60);
  auVar60 = vpaddd_avx2(auVar60,auVar64);
  auVar54 = vpsrad_avx2(auVar60,auVar65);
  auVar60 = vpaddd_avx2(auVar54,auVar46);
  auVar14 = vpsubd_avx2(auVar46,auVar54);
  auVar46 = vpsrad_avx2(auVar56,auVar65);
  auVar54 = vpaddd_avx2(auVar46,auVar61);
  auVar15 = vpsubd_avx2(auVar61,auVar46);
  auVar46 = vpaddd_avx2(auVar57,auVar62);
  auVar16 = vpsubd_avx2(auVar57,auVar62);
  auVar56 = vpmaxsd_avx2(auVar28,auVar19);
  auVar57 = vpminsd_avx2(auVar56,auVar27);
  auVar56 = vpmaxsd_avx2(auVar28,auVar21);
  auVar61 = vpminsd_avx2(auVar56,auVar27);
  auVar56 = vpmulld_avx2(auVar57,auVar59);
  auVar56 = vpaddd_avx2(auVar56,auVar64);
  auVar62 = vpmulld_avx2(auVar61,auVar69);
  auVar56 = vpaddd_avx2(auVar56,auVar62);
  auVar55 = vpmaxsd_avx2(auVar28,auVar55);
  auVar48 = vpminsd_avx2(auVar55,auVar27);
  auVar55 = vpmaxsd_avx2(auVar28,auVar18);
  auVar55 = vpminsd_avx2(auVar55,auVar27);
  auVar42 = vpmaxsd_avx2(auVar28,auVar42);
  auVar44 = vpminsd_avx2(auVar42,auVar27);
  auVar42 = vpmaxsd_avx2(auVar28,auVar10);
  auVar68 = vpminsd_avx2(auVar42,auVar27);
  auVar42 = vpmaxsd_avx2(auVar28,auVar20);
  auVar62 = vpminsd_avx2(auVar42,auVar27);
  auVar42 = vpmaxsd_avx2(auVar28,auVar43);
  auVar75 = vpminsd_avx2(auVar42,auVar27);
  auVar42 = vpaddd_avx2(auVar61,auVar57);
  auVar10 = vpmulld_avx2(auVar62,auVar69);
  auVar10 = vpaddd_avx2(auVar10,auVar64);
  auVar43 = vpmulld_avx2(auVar55,auVar59);
  auVar10 = vpaddd_avx2(auVar43,auVar10);
  auVar43 = vpaddd_avx2(auVar62,auVar55);
  auVar55 = vpaddd_avx2(auVar73,auVar63);
  auVar63 = vpsubd_avx2(auVar63,auVar73);
  auVar70 = vpmaxsd_avx2(auVar28,auVar70);
  auVar57 = vpmaxsd_avx2(auVar28,auVar47);
  auVar60 = vpmaxsd_avx2(auVar28,auVar60);
  auVar61 = vpmaxsd_avx2(auVar14,auVar28);
  auVar54 = vpmaxsd_avx2(auVar54,auVar28);
  auVar62 = vpmaxsd_avx2(auVar28,auVar15);
  auVar46 = vpmaxsd_avx2(auVar28,auVar46);
  auVar47 = vpmaxsd_avx2(auVar16,auVar28);
  auVar55 = vpmaxsd_avx2(auVar55,auVar28);
  auVar63 = vpmaxsd_avx2(auVar63,auVar28);
  auVar70 = vpminsd_avx2(auVar70,auVar27);
  auVar57 = vpminsd_avx2(auVar57,auVar27);
  auVar60 = vpminsd_avx2(auVar60,auVar27);
  auVar61 = vpminsd_avx2(auVar61,auVar27);
  auVar54 = vpminsd_avx2(auVar54,auVar27);
  auVar62 = vpminsd_avx2(auVar62,auVar27);
  auVar46 = vpminsd_avx2(auVar46,auVar27);
  auVar47 = vpminsd_avx2(auVar47,auVar27);
  local_260 = vpminsd_avx2(auVar55,auVar27);
  auVar55 = vpminsd_avx2(auVar63,auVar27);
  auVar50 = vpsrad_avx2(auVar50,auVar65);
  auVar63 = vpsrad_avx2(auVar41,auVar65);
  auVar73 = vpsrad_avx2(auVar40,auVar65);
  auVar14 = vpsrad_avx2(auVar66,auVar65);
  auVar49 = vpsrad_avx2(auVar49,auVar65);
  auVar15 = vpsrad_avx2(auVar52,auVar65);
  auVar40 = vpsrad_avx2(auVar45,auVar65);
  auVar53 = vpsrad_avx2(auVar53,auVar65);
  auVar56 = vpsrad_avx2(auVar56,auVar65);
  auVar41 = vpmulld_avx2(auVar69,auVar42);
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  auVar16 = vpsrad_avx2(auVar41,auVar65);
  auVar17 = vpsrad_avx2(auVar10,auVar65);
  auVar41 = vpmulld_avx2(auVar69,auVar43);
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  auVar43 = vpsrad_avx2(auVar41,auVar65);
  auVar41 = vpaddd_avx2(auVar12,auVar11);
  auVar66 = vpsubd_avx2(auVar11,auVar12);
  auVar12._4_4_ = local_480;
  auVar12._0_4_ = local_480;
  auVar12._8_4_ = local_480;
  auVar12._12_4_ = local_480;
  auVar12._16_4_ = local_480;
  auVar12._20_4_ = local_480;
  auVar12._24_4_ = local_480;
  auVar12._28_4_ = local_480;
  auVar41 = vpmaxsd_avx2(auVar41,auVar12);
  auVar11._4_4_ = local_4a0;
  auVar11._0_4_ = local_4a0;
  auVar11._8_4_ = local_4a0;
  auVar11._12_4_ = local_4a0;
  auVar11._16_4_ = local_4a0;
  auVar11._20_4_ = local_4a0;
  auVar11._24_4_ = local_4a0;
  auVar11._28_4_ = local_4a0;
  local_240 = vpminsd_avx2(auVar41,auVar11);
  auVar41 = vpaddd_avx2(auVar40,auVar50);
  auVar52 = vpsubd_avx2(auVar50,auVar40);
  auVar40 = vpmaxsd_avx2(auVar66,auVar12);
  auVar66 = vpminsd_avx2(auVar40,auVar11);
  auVar41 = vpmaxsd_avx2(auVar41,auVar12);
  local_220 = vpminsd_avx2(auVar41,auVar11);
  auVar41 = vpaddd_avx2(auVar49,auVar73);
  auVar45 = vpsubd_avx2(auVar73,auVar49);
  auVar40 = vpmaxsd_avx2(auVar52,auVar12);
  auVar49 = vpminsd_avx2(auVar40,auVar11);
  auVar41 = vpmaxsd_avx2(auVar41,auVar12);
  local_200 = vpminsd_avx2(auVar41,auVar11);
  auVar41 = vpaddd_avx2(auVar58,auVar79);
  auVar42 = vpsubd_avx2(auVar79,auVar58);
  auVar40 = vpmaxsd_avx2(auVar45,auVar12);
  auVar52 = vpminsd_avx2(auVar40,auVar11);
  auVar41 = vpmaxsd_avx2(auVar41,auVar12);
  local_80 = vpminsd_avx2(auVar41,auVar11);
  auVar41 = vpaddd_avx2(auVar74,auVar13);
  auVar10 = vpsubd_avx2(auVar13,auVar74);
  auVar40 = vpmaxsd_avx2(auVar42,auVar12);
  auVar45 = vpminsd_avx2(auVar40,auVar11);
  auVar41 = vpmaxsd_avx2(auVar41,auVar12);
  local_a0 = vpminsd_avx2(auVar41,auVar11);
  auVar41 = vpaddd_avx2(auVar53,auVar63);
  auVar42 = vpsubd_avx2(auVar63,auVar53);
  auVar40 = vpmaxsd_avx2(auVar10,auVar12);
  auVar53 = vpminsd_avx2(auVar40,auVar11);
  auVar41 = vpmaxsd_avx2(auVar41,auVar12);
  local_c0 = vpminsd_avx2(auVar41,auVar11);
  auVar41 = vpaddd_avx2(auVar15,auVar14);
  auVar10 = vpsubd_avx2(auVar14,auVar15);
  auVar40 = vpmaxsd_avx2(auVar42,auVar12);
  auVar42 = vpminsd_avx2(auVar40,auVar11);
  auVar41 = vpmaxsd_avx2(auVar41,auVar12);
  local_e0 = vpminsd_avx2(auVar41,auVar11);
  auVar41 = vpaddd_avx2(auVar70,auVar68);
  auVar70 = vpsubd_avx2(auVar70,auVar68);
  auVar40 = vpmaxsd_avx2(auVar10,auVar12);
  auVar10 = vpminsd_avx2(auVar40,auVar11);
  auVar41 = vpmaxsd_avx2(auVar41,auVar12);
  local_460 = (__m256i)vpminsd_avx2(auVar41,auVar11);
  auVar41 = vpmaxsd_avx2(auVar70,auVar12);
  local_280 = vpminsd_avx2(auVar41,auVar11);
  auVar41 = vpaddd_avx2(auVar60,auVar75);
  auVar40 = vpsubd_avx2(auVar60,auVar75);
  auVar41 = vpmaxsd_avx2(auVar41,auVar12);
  local_440 = vpminsd_avx2(auVar41,auVar11);
  auVar41 = vpmaxsd_avx2(auVar40,auVar12);
  local_2a0 = vpminsd_avx2(auVar41,auVar11);
  auVar41 = vpaddd_avx2(auVar16,auVar54);
  auVar40 = vpsubd_avx2(auVar54,auVar16);
  auVar41 = vpmaxsd_avx2(auVar41,auVar12);
  local_420 = vpminsd_avx2(auVar41,auVar11);
  auVar41 = vpmaxsd_avx2(auVar40,auVar12);
  local_2c0 = vpminsd_avx2(auVar41,auVar11);
  auVar41 = vpaddd_avx2(auVar43,auVar46);
  auVar40 = vpsubd_avx2(auVar46,auVar43);
  auVar41 = vpmaxsd_avx2(auVar41,auVar12);
  local_400 = vpminsd_avx2(auVar41,auVar11);
  auVar41 = vpmaxsd_avx2(auVar40,auVar12);
  local_2e0 = vpminsd_avx2(auVar41,auVar11);
  auVar41 = vpaddd_avx2(auVar17,auVar47);
  auVar40 = vpsubd_avx2(auVar47,auVar17);
  auVar41 = vpmaxsd_avx2(auVar41,auVar12);
  local_3e0 = vpminsd_avx2(auVar41,auVar11);
  auVar41 = vpmaxsd_avx2(auVar40,auVar12);
  local_300 = vpminsd_avx2(auVar41,auVar11);
  auVar41 = vpaddd_avx2(auVar56,auVar62);
  auVar40 = vpsubd_avx2(auVar62,auVar56);
  auVar41 = vpmaxsd_avx2(auVar41,auVar12);
  local_3c0 = vpminsd_avx2(auVar41,auVar11);
  auVar41 = vpmaxsd_avx2(auVar40,auVar12);
  local_320 = vpminsd_avx2(auVar41,auVar11);
  auVar41 = vpaddd_avx2(auVar61,auVar44);
  auVar40 = vpsubd_avx2(auVar61,auVar44);
  auVar41 = vpmaxsd_avx2(auVar41,auVar12);
  local_3a0 = vpminsd_avx2(auVar41,auVar11);
  auVar41 = vpmaxsd_avx2(auVar40,auVar12);
  local_340 = vpminsd_avx2(auVar41,auVar11);
  auVar41 = vpaddd_avx2(auVar57,auVar48);
  auVar40 = vpsubd_avx2(auVar57,auVar48);
  auVar41 = vpmaxsd_avx2(auVar41,auVar12);
  auVar40 = vpmaxsd_avx2(auVar40,auVar12);
  local_380 = vpminsd_avx2(auVar41,auVar11);
  local_360 = vpminsd_avx2(auVar40,auVar11);
  auVar41 = vpmulld_avx2(auVar52,auVar59);
  auVar40 = vpmulld_avx2(auVar10,auVar69);
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  auVar41 = vpaddd_avx2(auVar41,auVar40);
  auVar40 = vpaddd_avx2(auVar52,auVar10);
  local_1e0 = vpsrad_avx2(auVar41,auVar65);
  auVar41 = vpmulld_avx2(auVar40,auVar69);
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  local_100 = vpsrad_avx2(auVar41,auVar65);
  auVar41 = vpmulld_avx2(auVar49,auVar59);
  auVar40 = vpmulld_avx2(auVar42,auVar69);
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  auVar41 = vpaddd_avx2(auVar41,auVar40);
  auVar40 = vpaddd_avx2(auVar49,auVar42);
  local_1c0 = vpsrad_avx2(auVar41,auVar65);
  auVar41 = vpmulld_avx2(auVar40,auVar69);
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  local_120 = vpsrad_avx2(auVar41,auVar65);
  auVar41 = vpmulld_avx2(auVar66,auVar59);
  auVar40 = vpmulld_avx2(auVar53,auVar69);
  auVar41 = vpaddd_avx2(auVar41,auVar64);
  auVar41 = vpaddd_avx2(auVar41,auVar40);
  auVar40 = vpaddd_avx2(auVar53,auVar66);
  auVar40 = vpmulld_avx2(auVar40,auVar69);
  auVar40 = vpaddd_avx2(auVar40,auVar64);
  local_140 = vpsrad_avx2(auVar40,auVar65);
  local_1a0 = vpsrad_avx2(auVar41,auVar65);
  auVar40 = vpmulld_avx2(auVar55,auVar59);
  auVar41 = vpmulld_avx2(auVar45,auVar69);
  auVar41 = vpaddd_avx2(auVar64,auVar41);
  auVar41 = vpaddd_avx2(auVar40,auVar41);
  auVar40 = vpaddd_avx2(auVar45,auVar55);
  auVar40 = vpmulld_avx2(auVar40,auVar69);
  auVar40 = vpaddd_avx2(auVar40,auVar64);
  local_180 = vpsrad_avx2(auVar41,auVar65);
  local_160 = vpsrad_avx2(auVar40,auVar65);
  iStack_49c = local_4a0;
  iStack_498 = local_4a0;
  iStack_494 = local_4a0;
  iStack_490 = local_4a0;
  iStack_48c = local_4a0;
  iStack_488 = local_4a0;
  iStack_484 = local_4a0;
  iStack_47c = local_480;
  iStack_478 = local_480;
  iStack_474 = local_480;
  iStack_470 = local_480;
  iStack_46c = local_480;
  iStack_468 = local_480;
  iStack_464 = local_480;
  idct32_stage9_avx2(&local_460,out,do_cols,bd,out_shift,(__m256i *)&local_480,(__m256i *)&local_4a0
                    );
  return;
}

Assistant:

static void idct32_low16_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  // stage 1
  __m256i x[32];
  x[0] = input[0];
  x[2] = input[8];
  x[4] = input[4];
  x[6] = input[12];
  x[8] = input[2];
  x[10] = input[10];
  x[12] = input[6];
  x[14] = input[14];
  x[16] = input[1];
  x[18] = input[9];
  x[20] = input[5];
  x[22] = input[13];
  x[24] = input[3];
  x[26] = input[11];
  x[28] = input[7];
  x[30] = input[15];

  // stage 2
  btf_16_w16_0_avx2(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_w16_0_avx2(-cospi[34], cospi[30], x[30], x[17], x[30]);
  btf_16_w16_0_avx2(cospi[46], cospi[18], x[18], x[18], x[29]);
  btf_16_w16_0_avx2(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_w16_0_avx2(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_w16_0_avx2(-cospi[42], cospi[22], x[26], x[21], x[26]);
  btf_16_w16_0_avx2(cospi[38], cospi[26], x[22], x[22], x[25]);
  btf_16_w16_0_avx2(-cospi[58], cospi[6], x[24], x[23], x[24]);

  // stage 3
  btf_16_w16_0_avx2(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_w16_0_avx2(-cospi[36], cospi[28], x[14], x[9], x[14]);
  btf_16_w16_0_avx2(cospi[44], cospi[20], x[10], x[10], x[13]);
  btf_16_w16_0_avx2(-cospi[52], cospi[12], x[12], x[11], x[12]);
  idct32_high16_stage3_avx2(x);

  // stage 4
  btf_16_w16_0_avx2(cospi[56], cospi[8], x[4], x[4], x[7]);
  btf_16_w16_0_avx2(-cospi[40], cospi[24], x[6], x[5], x[6]);
  btf_16_adds_subs_avx2(&x[8], &x[9]);
  btf_16_adds_subs_avx2(&x[11], &x[10]);
  btf_16_adds_subs_avx2(&x[12], &x[13]);
  btf_16_adds_subs_avx2(&x[15], &x[14]);
  idct32_high16_stage4_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 5
  btf_16_w16_0_avx2(cospi[32], cospi[32], x[0], x[0], x[1]);
  btf_16_w16_0_avx2(cospi[48], cospi[16], x[2], x[2], x[3]);
  btf_16_adds_subs_avx2(&x[4], &x[5]);
  btf_16_adds_subs_avx2(&x[7], &x[6]);
  idct32_high24_stage5_avx2(x, cospi, _r, INV_COS_BIT);

  btf_16_adds_subs_avx2(&x[0], &x[3]);
  btf_16_adds_subs_avx2(&x[1], &x[2]);
  idct32_high28_stage6_avx2(x, cospi, _r, INV_COS_BIT);

  idct32_stage7_avx2(x, cospi, _r, INV_COS_BIT);
  idct32_stage8_avx2(x, cospi, _r, INV_COS_BIT);
  idct32_stage9_avx2(output, x);
}